

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChVector<int>>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
          *bVal)

{
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *pvVar1;
  pointer pCVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ChVector<int> element;
  size_t arraysize;
  char idname [20];
  ChVector<int> local_74;
  size_type local_68;
  ChNameValue<chrono::ChVector<int>_> local_60;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  pCVar2 = (pvVar1->
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (pvVar1->super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_68);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::resize
            (bVal->_value,local_68);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < local_68; uVar3 = uVar3 + 1) {
    sprintf(local_48,"%lu",uVar3);
    local_74.m_data[0] = 0;
    local_74.m_data[1] = 0;
    local_74.m_data[2] = 0;
    local_60._flags = '\0';
    local_60._name = local_48;
    local_60._value = &local_74;
    in<chrono::ChVector<int>>(this,&local_60);
    pCVar2 = (bVal->_value->
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ChVector<int> *)((long)pCVar2->m_data + lVar4) != &local_74) {
      *(int *)((long)pCVar2->m_data + lVar4) = local_74.m_data[0];
      *(int *)((long)pCVar2->m_data + lVar4 + 4) = local_74.m_data[1];
      *(int *)((long)pCVar2->m_data + lVar4 + 8) = local_74.m_data[2];
    }
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    lVar4 = lVar4 + 0xc;
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }